

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmapbuilder.cpp
# Opt level: O2

png_bytepp readPngFile(string *path,int *rowBytes,int *width,int *height)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  FILE *__stream;
  size_t sVar4;
  png_infop ppVar5;
  __jmp_buf_tag *__env;
  png_bytepp pppVar6;
  png_byte *ppVar7;
  runtime_error *prVar8;
  ulong uVar9;
  png_structp png;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  png_infop pngInfo;
  uchar header [8];
  string local_50;
  
  __stream = fopen((path->_M_dataplus)._M_p,"rb");
  if (__stream == (FILE *)0x0) {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)&local_50,"Couldn\'t open %s for reading!\n",(allocator *)&local_80);
    formatString<char_const*>(&local_a0,&local_50,(path->_M_dataplus)._M_p);
    std::runtime_error::runtime_error(prVar8,(string *)&local_a0);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  sVar4 = fread(header,1,8,__stream);
  if (sVar4 != 8) {
    fclose(__stream);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_80,"Error in reading ",path);
    std::operator+(&local_a0,&local_80,": png is wayyy to small lmao!\n");
    std::runtime_error::runtime_error(prVar8,(string *)&local_a0);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = png_sig_cmp(header,0,8);
  if (iVar2 != 0) {
    fclose(__stream);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_80,"Error in reading ",path);
    std::operator+(&local_a0,&local_80,": this is not a valid png!\n");
    std::runtime_error::runtime_error(prVar8,(string *)&local_a0);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  png = (png_structp)png_create_read_struct("1.6.37",0,0);
  if (png != (png_structp)0x0) {
    ppVar5 = (png_infop)png_create_info_struct(png);
    pngInfo = ppVar5;
    if (ppVar5 == (png_infop)0x0) {
      fclose(__stream);
      png_destroy_read_struct(&png,0);
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_80,"Error in libpng for ",path);
      std::operator+(&local_a0,&local_80,"!\n");
      std::runtime_error::runtime_error(prVar8,(string *)&local_a0);
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    __env = (__jmp_buf_tag *)png_set_longjmp_fn(png,longjmp,200);
    iVar2 = _setjmp(__env);
    if (iVar2 == 0) {
      png_init_io(png,__stream);
      png_set_sig_bytes(png,8);
      png_read_info(png,ppVar5);
      if (width != (int *)0x0) {
        iVar2 = png_get_image_width(png,ppVar5);
        *width = iVar2;
      }
      if (height != (int *)0x0) {
        iVar2 = png_get_image_height(png,ppVar5);
        *height = iVar2;
      }
      if (rowBytes != (int *)0x0) {
        iVar2 = png_get_rowbytes(png,ppVar5);
        *rowBytes = iVar2;
      }
      uVar1 = *height;
      pppVar6 = (png_bytepp)malloc((long)(int)uVar1 << 3);
      uVar9 = 0;
      uVar3 = 0;
      if (0 < (int)uVar1) {
        uVar3 = uVar1;
      }
      for (; uVar3 != uVar9; uVar9 = uVar9 + 1) {
        ppVar7 = (png_byte *)malloc((long)*rowBytes);
        pppVar6[uVar9] = ppVar7;
      }
      png_read_image(png,pppVar6);
      png_destroy_read_struct(&png,&pngInfo,0);
      fclose(__stream);
      return pppVar6;
    }
    fclose(__stream);
    png_destroy_read_struct(&png,0);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_80,"Error in libpng for ",path);
    std::operator+(&local_a0,&local_80,"!\n");
    std::runtime_error::runtime_error(prVar8,(string *)&local_a0);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  fclose(__stream);
  prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_80,"Error in libpng for ",path);
  std::operator+(&local_a0,&local_80,"!\n");
  std::runtime_error::runtime_error(prVar8,(string *)&local_a0);
  __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

png_bytepp readPngFile(std::string path, int *rowBytes, int *width, int*height){
    unsigned char header[8];
    FILE *file = fopen(path.c_str(),"rb");
    if (file == nullptr)
        throw CANT_READ(path.c_str());

    const int cmpNum = 8;
    if( fread(header,1,cmpNum,file) != cmpNum){
        fclose(file);
        throw std::runtime_error("Error in reading "+path+": png is wayyy to small lmao!\n");
    }
    if (png_sig_cmp(header,0,cmpNum) != 0){
        fclose(file);
        throw std::runtime_error("Error in reading "+path+": this is not a valid png!\n");
    }

    png_structp png = png_create_read_struct(PNG_LIBPNG_VER_STRING,NULL,NULL,NULL);
    if (png == NULL){
        fclose(file);
        throw std::runtime_error("Error in libpng for "+path+"!\n");
    }

    png_infop pngInfo = png_create_info_struct(png);
    if (pngInfo == nullptr){
        fclose(file);
        png_destroy_read_struct(&png, NULL ,NULL);
        throw std::runtime_error("Error in libpng for "+path+"!\n");
    }

    if (setjmp(png_jmpbuf(png))){
        fclose(file);
        png_destroy_read_struct(&png, NULL ,NULL);
        throw std::runtime_error("Error in libpng for "+path+"!\n");
    }

    png_init_io(png,file);
    png_set_sig_bytes(png, cmpNum);
    png_read_info(png,pngInfo);
    if(width != nullptr)
        *width = png_get_image_width(png, pngInfo);
    if (height != nullptr)
        *height = png_get_image_height(png, pngInfo);
    if (rowBytes != nullptr)
        *rowBytes = png_get_rowbytes(png, pngInfo);

    png_bytepp rows = (png_bytepp)malloc(sizeof(png_bytep) * *height);
    for(int y=0;y< *height;y++)
        rows[y] = (png_bytep)malloc(*rowBytes);
    png_read_image(png,rows);
    png_destroy_read_struct(&png, &pngInfo, NULL);

    fclose(file);
    return rows;
}